

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

result<unsigned_long> * __thiscall
sockpp::socket::recv_from
          (result<unsigned_long> *__return_storage_ptr__,socket *this,void *buf,size_t n,int flags,
          sock_address *srcAddr)

{
  int iVar1;
  undefined4 extraout_var;
  socket *this_00;
  long ret;
  socklen_t len;
  socklen_t local_34;
  sockaddr *__addr;
  
  local_34 = 0;
  if (srcAddr == (sock_address *)0x0) {
    __addr = (sockaddr *)0x0;
  }
  else {
    iVar1 = (*srcAddr->_vptr_sock_address[3])(srcAddr);
    __addr = (sockaddr *)CONCAT44(extraout_var,iVar1);
    local_34 = (*srcAddr->_vptr_sock_address[2])(srcAddr);
  }
  this_00 = (socket *)recvfrom(this->handle_,buf,n,flags,__addr,&local_34);
  check_res<long,unsigned_long>(__return_storage_ptr__,this_00,ret);
  return __return_storage_ptr__;
}

Assistant:

result<size_t>
socket::recv_from(void* buf, size_t n, int flags, sock_address* srcAddr /*=nullptr*/) {
    sockaddr* p = srcAddr ? srcAddr->sockaddr_ptr() : nullptr;
    socklen_t len = srcAddr ? srcAddr->size() : 0;

    // TODO: Check returned length

#if defined(_WIN32)
    return check_res<ssize_t, size_t>(
        ::recvfrom(handle(), reinterpret_cast<char*>(buf), int(n), flags, p, &len)
    );
#else
    return check_res<ssize_t, size_t>(::recvfrom(handle(), buf, n, flags, p, &len));
#endif
}